

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_display.cxx
# Opt level: O3

void Fl::display(char *d)

{
  char *c;
  char *pcVar1;
  
  builtin_strncpy(display::e,"DISPLAY=",9);
  pcVar1 = display::e + 8;
  fl_strlcat(display::e,d,0x400);
  do {
    if (*pcVar1 == ':') {
LAB_001defcd:
      putenv(display::e);
      return;
    }
    if (*pcVar1 == '\0') {
      fl_strlcat(display::e,":0.0",0x400);
      goto LAB_001defcd;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

void Fl::display(const char *d) {
#if defined(__APPLE__) || defined(WIN32)
  (void)d;
#else
  static char e[1024];
  strcpy(e,"DISPLAY=");
  strlcat(e,d,sizeof(e));
  for (char *c = e+8; *c!=':'; c++) {
    if (!*c) {
      strlcat(e,":0.0",sizeof(e));
      break;
    }
  }
  putenv(e);
#endif // __APPLE__
}